

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcMechanicalFastenerType::~IfcMechanicalFastenerType
          (IfcMechanicalFastenerType *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x28 = 0x85e668;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x10 = 0x85e730;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 = 0x85e690;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0xc0 = 0x85e6b8;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.field_0x118 = 0x85e6e0;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.field_0x170 =
       0x85e708;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
             field_0x180;
  puVar1 = &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
            field_0x190;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x28 = 0x85e758;
  *(undefined8 *)
   &(this->super_IfcFastenerType).super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0x10 = 0x85e7f8;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 = 0x85e780;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.super_IfcTypeObject.field_0xc0 = 0x85e7a8;
  *(undefined8 *)
   &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
    super_IfcTypeProduct.field_0x118 = 0x85e7d0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
             super_IfcTypeProduct.field_0x148;
  puVar1 = &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
            super_IfcTypeProduct.field_0x158;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  pvVar3 = (void *)this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType
                   .super_IfcTypeProduct.Tag.ptr._M_string_length;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)((long)&this[-1].super_IfcFastenerType.
                                            super_IfcElementComponentType.super_IfcElementType.
                                            super_IfcTypeProduct.Tag.ptr.field_2 + 8) - (long)pvVar3
                   );
  }
  IfcTypeObject::~IfcTypeObject
            ((IfcTypeObject *)
             &this[-1].super_IfcFastenerType.super_IfcElementComponentType.super_IfcElementType.
              super_IfcTypeProduct.super_IfcTypeObject.field_0x28,
             &PTR_construction_vtable_24__0085e240);
  return;
}

Assistant:

IfcMechanicalFastenerType() : Object("IfcMechanicalFastenerType") {}